

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# headergen.c
# Opt level: O2

int main(int argc,char **argv)

{
  char cVar1;
  char *pcVar2;
  rnndomain *prVar3;
  fout f;
  fout *pfVar4;
  char cVar5;
  rnndb *db;
  size_t sVar6;
  char *pcVar7;
  FILE *pFVar8;
  char *pcVar9;
  ushort **ppuVar10;
  __int32_t **pp_Var11;
  rnnenum *prVar12;
  rnnbitset *prVar13;
  int iVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  
  if (argc < 2) {
    fwrite("Usage:\n\theadergen database-file\n",0x20,1,_stderr);
  }
  else {
    lVar16 = 0;
    rnn_init();
    db = rnn_newdb();
    rnn_parsefile(db,argv[1]);
    rnn_prepdb(db);
    while( true ) {
      if (db->filesnum <= lVar16) {
        for (lVar16 = 0; lVar16 < db->enumsnum; lVar16 = lVar16 + 1) {
          prVar12 = db->enums[lVar16];
          if (prVar12->isinline == 0) {
            for (lVar17 = 0; lVar17 < prVar12->valsnum; lVar17 = lVar17 + 1) {
              printvalue(prVar12->vals[lVar17],0);
              prVar12 = db->enums[lVar16];
            }
          }
        }
        for (lVar16 = 0; lVar16 < db->bitsetsnum; lVar16 = lVar16 + 1) {
          prVar13 = db->bitsets[lVar16];
          if (prVar13->isinline == 0) {
            for (lVar17 = 0; lVar17 < prVar13->bitfieldsnum; lVar17 = lVar17 + 1) {
              printbitfield(prVar13->bitfields[lVar17],0);
              prVar13 = db->bitsets[lVar16];
            }
          }
        }
        for (lVar16 = 0; lVar16 < db->domainsnum; lVar16 = lVar16 + 1) {
          prVar3 = db->domains[lVar16];
          if (prVar3->size != 0) {
            printdef(prVar3->fullname,"SIZE",0,prVar3->size,prVar3->file);
          }
          for (lVar17 = 0; lVar17 < db->domains[lVar16]->subelemsnum; lVar17 = lVar17 + 1) {
            printdelem(db->domains[lVar16]->subelems[lVar17],0);
          }
        }
        lVar16 = 0x10;
        for (lVar17 = 0; lVar17 < foutsnum; lVar17 = lVar17 + 1) {
          fprintf(*(FILE **)((long)fouts + lVar16 + -8),"\n#endif /* %s */\n",
                  *(undefined8 *)((long)&fouts->name + lVar16));
          lVar16 = lVar16 + 0x18;
        }
        iVar14 = db->estatus;
        rnn_freedb(db);
        rnn_fini();
        return iVar14;
      }
      pcVar2 = db->files[lVar16];
      sVar6 = strlen(pcVar2);
      pcVar7 = (char *)malloc(sVar6 + 3);
      strcpy(pcVar7,pcVar2);
      sVar6 = strlen(pcVar7);
      (pcVar7 + sVar6)[0] = '.';
      (pcVar7 + sVar6)[1] = 'h';
      pcVar7[sVar6 + 2] = '\0';
      pcVar2 = db->files[lVar16];
      pFVar8 = fopen(pcVar7,"w");
      if (pFVar8 == (FILE *)0x0) break;
      free(pcVar7);
      pcVar9 = strrchr(pcVar2,0x2f);
      pcVar7 = pcVar9 + 1;
      if (pcVar9 == (char *)0x0) {
        pcVar7 = pcVar2;
      }
      pcVar7 = strdup(pcVar7);
      uVar15 = 0;
      while( true ) {
        sVar6 = strlen(pcVar7);
        if (sVar6 <= uVar15) break;
        ppuVar10 = __ctype_b_loc();
        cVar1 = pcVar7[uVar15];
        cVar5 = '_';
        if (((*ppuVar10)[cVar1] & 8) != 0) {
          pp_Var11 = __ctype_toupper_loc();
          cVar5 = (char)(*pp_Var11)[cVar1];
        }
        pcVar7[uVar15] = cVar5;
        uVar15 = uVar15 + 1;
      }
      iVar14 = foutsnum;
      if (foutsmax <= foutsnum) {
        iVar14 = foutsmax * 2;
        if (foutsmax == 0) {
          iVar14 = 0x10;
        }
        foutsmax = iVar14;
        fouts = (fout *)realloc(fouts,(long)iVar14 * 0x18);
        iVar14 = foutsnum;
      }
      pfVar4 = fouts;
      foutsnum = iVar14 + 1;
      fouts[iVar14].guard = pcVar7;
      pfVar4[iVar14].name = pcVar2;
      pfVar4[iVar14].file = (FILE *)pFVar8;
      f.file = (FILE *)pFVar8;
      f.name = pcVar2;
      f.guard = pcVar7;
      printhead(f,db);
      lVar16 = lVar16 + 1;
    }
    perror(pcVar7);
  }
  exit(1);
}

Assistant:

int main(int argc, char **argv) {
	struct rnndb *db;
	int i, j, ret;

	if (argc < 2) {
		fprintf(stderr, "Usage:\n\theadergen database-file\n");
		exit(1);
	}

	rnn_init();
	db = rnn_newdb();
	rnn_parsefile (db, argv[1]);
	rnn_prepdb (db);
	for(i = 0; i < db->filesnum; ++i) {
		char *dstname = malloc(strlen(db->files[i]) + 3);
		char *pretty;
		strcpy(dstname, db->files[i]);
		strcat(dstname, ".h");
		struct fout f = { db->files[i], fopen(dstname, "w") };
		if (!f.file) {
			perror(dstname);
			exit(1);
		}
		free(dstname);
		pretty = strrchr(f.name, '/');
		if (pretty)
			pretty += 1;
		else
			pretty = f.name;
		f.guard = strdup(pretty);
		for (j = 0; j < strlen(f.guard); j++)
			if (isalnum(f.guard[j]))
				f.guard[j] = toupper(f.guard[j]);
			else
				f.guard[j] = '_';
		ADDARRAY(fouts, f);
		printhead(f, db);
	}

	for (i = 0; i < db->enumsnum; i++) {
		if (db->enums[i]->isinline)
			continue;
		int j;
		for (j = 0; j < db->enums[i]->valsnum; j++)
			printvalue (db->enums[i]->vals[j], 0);
	}
	for (i = 0; i < db->bitsetsnum; i++) {
		if (db->bitsets[i]->isinline)
			continue;
		int j;
		for (j = 0; j < db->bitsets[i]->bitfieldsnum; j++)
			printbitfield (db->bitsets[i]->bitfields[j], 0);
	}
	for (i = 0; i < db->domainsnum; i++) {
		if (db->domains[i]->size)
			printdef (db->domains[i]->fullname, "SIZE", 0, db->domains[i]->size, db->domains[i]->file);
		int j;
		for (j = 0; j < db->domains[i]->subelemsnum; j++) {
			printdelem(db->domains[i]->subelems[j], 0);
		}
	}
	for(i = 0; i < foutsnum; ++i) {
		fprintf (fouts[i].file, "\n#endif /* %s */\n", fouts[i].guard);
	}
	ret = db->estatus;

	rnn_freedb(db);
	rnn_fini();

	return ret;
}